

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionInfo.cpp
# Opt level: O1

void __thiscall chrono::collision::ChCollisionInfo::ChCollisionInfo(ChCollisionInfo *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->modelA = (ChCollisionModel *)0x0;
  this->modelB = (ChCollisionModel *)0x0;
  this->shapeA = (ChCollisionShape *)0x0;
  this->shapeB = (ChCollisionShape *)0x0;
  dVar1 = VNULL;
  (this->vpA).m_data[0] = VNULL;
  dVar2 = DAT_00b90ac0;
  (this->vpA).m_data[1] = DAT_00b90ac0;
  dVar3 = DAT_00b90ac8;
  (this->vpA).m_data[2] = DAT_00b90ac8;
  (this->vpB).m_data[0] = dVar1;
  (this->vpB).m_data[1] = dVar2;
  (this->vpB).m_data[2] = dVar3;
  (this->vN).m_data[0] = 1.0;
  *(undefined1 (*) [16])((this->vN).m_data + 1) = ZEXT816(0) << 0x20;
  this->distance = 0.0;
  this->eff_radius = default_eff_radius;
  this->reaction_cache = (float *)0x0;
  return;
}

Assistant:

ChCollisionInfo::ChCollisionInfo()
    : modelA(nullptr),
      modelB(nullptr),
      shapeA(nullptr),
      shapeB(nullptr),
      vpA(VNULL),
      vpB(VNULL),
      vN(ChVector<>(1, 0, 0)),
      distance(0),
      eff_radius(default_eff_radius),
      reaction_cache(nullptr) {}